

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImVector<ImGuiWindow_*> *in_RSI;
  ImGuiWindow *child;
  int i;
  int count;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  int iVar2;
  int iVar3;
  
  ImVector<ImGuiWindow_*>::push_back
            ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
             (ImGuiWindow **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (((ulong)in_RSI[7].Data & 0x1000000000000) != 0) {
    iVar3 = *(int *)&in_RSI[0x18].Data;
    if (1 < iVar3) {
      qsort(*(void **)(in_RSI + 0x19),(long)iVar3,8,ChildWindowComparer);
    }
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
                           in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffe0 = *ppIVar1;
      if ((in_stack_ffffffffffffffe0->Active & 1U) != 0) {
        AddWindowToSortBuffer(in_RSI,(ImGuiWindow *)CONCAT44(iVar3,iVar2));
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}